

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_manyvector.c
# Opt level: O2

int check_ans(sunrealtype ans,N_Vector X,sunindextype param_3)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar10 = 0;
  uVar3 = N_VGetSubvector_ManyVector(X,0);
  uVar4 = N_VGetSubvector_ManyVector(X,1);
  uVar5 = N_VGetLength(uVar3);
  lVar6 = N_VGetLength(uVar4);
  lVar7 = N_VGetSubvectorArrayPointer_ManyVector(X,0);
  lVar8 = N_VGetSubvectorArrayPointer_ManyVector(X,1);
  if (lVar6 + uVar5 == param_3) {
    if ((long)uVar5 < 1) {
      uVar5 = uVar10;
    }
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = SUNRCompare(*(undefined8 *)(lVar7 + uVar9 * 8),ans);
      uVar10 = (ulong)(uint)((int)uVar10 + iVar1);
    }
    lVar7 = 0;
    if (lVar6 < 1) {
      lVar6 = lVar7;
    }
    for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
      iVar1 = SUNRCompare(*(undefined8 *)(lVar8 + lVar7 * 8),ans);
      uVar10 = (ulong)(uint)((int)uVar10 + iVar1);
    }
    uVar2 = (uint)(0 < (int)uVar10);
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int check_ans(sunrealtype ans, N_Vector X, sunindextype local_length)
{
  int failure = 0;
  sunindextype i;
  N_Vector Xsub[2];
  sunrealtype *x0, *x1;
  sunindextype x0len, x1len;

  Xsub[0] = N_VGetSubvector_ManyVector(X, 0);
  Xsub[1] = N_VGetSubvector_ManyVector(X, 1);
  x0len   = N_VGetLength(Xsub[0]);
  x1len   = N_VGetLength(Xsub[1]);
  x0      = N_VGetSubvectorArrayPointer_ManyVector(X, 0);
  x1      = N_VGetSubvectorArrayPointer_ManyVector(X, 1);

  /* ensure that local_length = x0len + x1len */
  if (local_length != x0len + x1len) { return (1); }

  /* check vector data */
  for (i = 0; i < x0len; i++) { failure += SUNRCompare(x0[i], ans); }
  for (i = 0; i < x1len; i++) { failure += SUNRCompare(x1[i], ans); }

  return (failure > ZERO) ? (1) : (0);
}